

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShadingLanguage420PackTests.cpp
# Opt level: O0

void __thiscall
gl4cts::GLSL420Pack::LineContinuationTest::prepareShaderSourceForDraw
          (LineContinuationTest *this,SHADER_STAGES stage,bool use_version_400,shaderSource *source)

{
  pointer *this_00;
  GLchar *pGVar1;
  bool bVar2;
  GLchar *pGVar3;
  GLchar *pGVar4;
  GLchar *text;
  size_t sVar5;
  reference pvVar6;
  reference local_218;
  uint local_1bc;
  GLuint i;
  string *shader_source_part_1;
  string *shader_source_part_0;
  size_t position;
  uint local_198;
  uint uStack_194;
  bool is_multipart;
  GLuint pass_condition_length;
  GLuint store_results_length;
  GLchar *pass_condition;
  GLchar *store_results;
  string out_color_definition;
  string in_color_definition;
  string out_tex_coord_definition;
  string in_tex_coord_definition;
  string out_color_reference;
  string in_color_reference;
  string out_tex_coord_reference;
  string in_tex_coord_reference;
  value_type local_6c;
  undefined1 local_68 [8];
  qualifierSet out;
  qualifierSet in;
  GLchar *expected_value;
  GLchar *stage_specific_layout;
  GLchar *version;
  shaderSource *source_local;
  bool use_version_400_local;
  SHADER_STAGES stage_local;
  LineContinuationTest *this_local;
  
  pGVar3 = TestBase::getVersionString((TestBase *)this,stage,use_version_400);
  pGVar4 = TestBase::getStageSpecificLayout((TestBase *)this,stage);
  text = getExpectedValueString(this);
  this_00 = &out.
             super__Vector_base<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
  std::
  vector<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>
  ::vector((vector<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>
            *)this_00);
  std::
  vector<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>
  ::vector((vector<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>
            *)local_68);
  local_6c = QUAL_IN;
  std::
  vector<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>
  ::push_back((vector<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>
               *)this_00,&local_6c);
  in_tex_coord_reference.field_2._8_4_ = 3;
  std::
  vector<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>
  ::push_back((vector<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>
               *)local_68,(value_type *)(in_tex_coord_reference.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)(out_tex_coord_reference.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)(in_color_reference.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)(out_color_reference.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)(in_tex_coord_definition.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)(out_tex_coord_definition.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)(in_color_definition.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)(out_color_definition.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)&store_results);
  Utils::prepareVariableStrings
            (stage,INPUT,
             (qualifierSet *)
             &out.
              super__Vector_base<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,"vec2",m_texture_coordinates_name,
             (string *)(out_tex_coord_definition.field_2._M_local_buf + 8),
             (string *)(out_tex_coord_reference.field_2._M_local_buf + 8));
  Utils::prepareVariableStrings
            (stage,OUTPUT,(qualifierSet *)local_68,"vec2",m_texture_coordinates_name,
             (string *)((long)&in_color_definition.field_2 + 8),
             (string *)((long)&in_color_reference.field_2 + 8));
  Utils::prepareVariableStrings
            (stage,INPUT,
             (qualifierSet *)
             &out.
              super__Vector_base<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,"vec4",
             prepareShaderSourceForDraw::color_name,
             (string *)((long)&out_color_definition.field_2 + 8),
             (string *)((long)&out_color_reference.field_2 + 8));
  Utils::prepareVariableStrings
            (stage,OUTPUT,(qualifierSet *)local_68,"vec4",prepareShaderSourceForDraw::color_name,
             (string *)&store_results,(string *)((long)&in_tex_coord_definition.field_2 + 8));
  std::__cxx11::string::append(out_tex_coord_definition.field_2._M_local_buf + 8);
  std::__cxx11::string::append(in_color_definition.field_2._M_local_buf + 8);
  std::__cxx11::string::append(out_color_definition.field_2._M_local_buf + 8);
  std::__cxx11::string::append((char *)&store_results);
  pass_condition = prepareShaderSourceForDraw::store_results_template;
  _pass_condition_length = prepareShaderSourceForDraw::pass_condition_template;
  switch(stage) {
  case VERTEX_SHADER:
    _pass_condition_length = prepareShaderSourceForDraw::pass_condition_vs_template;
    break;
  case TESS_CTRL_SHADER:
    pass_condition = prepareShaderSourceForDraw::store_results_tcs_template;
    break;
  default:
    break;
  case GEOMETRY_SHADER:
    pass_condition = prepareShaderSourceForDraw::store_results_gs_template;
    break;
  case FRAGMENT_SHADER:
    pass_condition = prepareShaderSourceForDraw::store_results_fs_template;
  }
  sVar5 = strlen(pass_condition);
  uStack_194 = (uint)sVar5;
  sVar5 = strlen(_pass_condition_length);
  local_198 = (uint)sVar5;
  bVar2 = isShaderMultipart(this);
  pGVar1 = prepareShaderSourceForDraw::shader_template_part_0;
  if (bVar2) {
    pvVar6 = std::
             vector<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart,_std::allocator<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart>_>
             ::operator[](&source->m_parts,0);
    std::__cxx11::string::operator=((string *)pvVar6,pGVar1);
    pGVar1 = prepareShaderSourceForDraw::shader_template_part_1;
    pvVar6 = std::
             vector<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart,_std::allocator<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart>_>
             ::operator[](&source->m_parts,1);
    std::__cxx11::string::operator=((string *)pvVar6,pGVar1);
    pvVar6 = std::
             vector<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart,_std::allocator<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart>_>
             ::operator[](&source->m_parts,0);
    replaceAllCaseTokens(this,&pvVar6->m_code);
    pvVar6 = std::
             vector<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart,_std::allocator<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart>_>
             ::operator[](&source->m_parts,1);
    replaceAllCaseTokens(this,&pvVar6->m_code);
  }
  else {
    pvVar6 = std::
             vector<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart,_std::allocator<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart>_>
             ::operator[](&source->m_parts,0);
    std::__cxx11::string::operator=((string *)pvVar6,pGVar1);
    pvVar6 = std::
             vector<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart,_std::allocator<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart>_>
             ::operator[](&source->m_parts,0);
    std::__cxx11::string::append((char *)pvVar6);
    pvVar6 = std::
             vector<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart,_std::allocator<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart>_>
             ::operator[](&source->m_parts,0);
    replaceAllCaseTokens(this,&pvVar6->m_code);
  }
  position._7_1_ = isShaderMultipart(this);
  shader_source_part_0 = (string *)0x0;
  pvVar6 = std::
           vector<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart,_std::allocator<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart>_>
           ::operator[](&source->m_parts,0);
  if ((position._7_1_ & 1) == 1) {
    local_218 = std::
                vector<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart,_std::allocator<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart>_>
                ::operator[](&source->m_parts,1);
  }
  else {
    local_218 = std::
                vector<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart,_std::allocator<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart>_>
                ::operator[](&source->m_parts,0);
  }
  Utils::replaceToken(prepareShaderSourceForDraw::token_version,(size_t *)&shader_source_part_0,
                      pGVar3,&pvVar6->m_code);
  Utils::replaceToken(prepareShaderSourceForDraw::token_stage_specific,
                      (size_t *)&shader_source_part_0,pGVar4,&pvVar6->m_code);
  pGVar3 = prepareShaderSourceForDraw::token_in_color_definition;
  if (stage == VERTEX_SHADER) {
    Utils::replaceToken(prepareShaderSourceForDraw::token_in_color_definition,
                        (size_t *)&shader_source_part_0,prepareShaderSourceForDraw::empty,
                        &pvVar6->m_code);
  }
  else {
    pGVar4 = (GLchar *)std::__cxx11::string::c_str();
    Utils::replaceToken(pGVar3,(size_t *)&shader_source_part_0,pGVar4,&pvVar6->m_code);
  }
  pGVar3 = prepareShaderSourceForDraw::token_in_tex_coord_definition;
  pGVar4 = (GLchar *)std::__cxx11::string::c_str();
  Utils::replaceToken(pGVar3,(size_t *)&shader_source_part_0,pGVar4,&pvVar6->m_code);
  pGVar3 = prepareShaderSourceForDraw::token_out_color_definition;
  pGVar4 = (GLchar *)std::__cxx11::string::c_str();
  Utils::replaceToken(pGVar3,(size_t *)&shader_source_part_0,pGVar4,&pvVar6->m_code);
  pGVar3 = prepareShaderSourceForDraw::token_out_tex_coord_definition;
  if (stage == FRAGMENT_SHADER) {
    Utils::replaceToken(prepareShaderSourceForDraw::token_out_tex_coord_definition,
                        (size_t *)&shader_source_part_0,prepareShaderSourceForDraw::empty,
                        &pvVar6->m_code);
  }
  else {
    pGVar4 = (GLchar *)std::__cxx11::string::c_str();
    Utils::replaceToken(pGVar3,(size_t *)&shader_source_part_0,pGVar4,&pvVar6->m_code);
  }
  pGVar3 = prepareShaderSourceForDraw::token_out_color;
  pGVar4 = (GLchar *)std::__cxx11::string::c_str();
  Utils::replaceToken(pGVar3,(size_t *)&shader_source_part_0,pGVar4,&pvVar6->m_code);
  pGVar3 = prepareShaderSourceForDraw::token_texture_coordinates;
  if ((position._7_1_ & 1) == 1) {
    shader_source_part_0 = (string *)0x0;
  }
  pGVar4 = (GLchar *)std::__cxx11::string::c_str();
  Utils::replaceToken(pGVar3,(size_t *)&shader_source_part_0,pGVar4,&local_218->m_code);
  Utils::replaceToken(prepareShaderSourceForDraw::token_pass_condition,
                      (size_t *)&shader_source_part_0,_pass_condition_length,&local_218->m_code);
  shader_source_part_0 = (string *)((long)shader_source_part_0 - (ulong)local_198);
  Utils::replaceToken(prepareShaderSourceForDraw::token_expected_value,
                      (size_t *)&shader_source_part_0,text,&local_218->m_code);
  pGVar3 = prepareShaderSourceForDraw::token_in_color;
  if (stage != VERTEX_SHADER) {
    pGVar4 = (GLchar *)std::__cxx11::string::c_str();
    Utils::replaceToken(pGVar3,(size_t *)&shader_source_part_0,pGVar4,&local_218->m_code);
  }
  Utils::replaceToken(prepareShaderSourceForDraw::token_store_results,
                      (size_t *)&shader_source_part_0,pass_condition,&local_218->m_code);
  pGVar3 = prepareShaderSourceForDraw::token_texture_coordinates;
  shader_source_part_0 = (string *)((long)shader_source_part_0 - (ulong)uStack_194);
  if (stage == GEOMETRY_SHADER) {
    for (local_1bc = 0; pGVar3 = prepareShaderSourceForDraw::token_texture_coordinates,
        local_1bc < 4; local_1bc = local_1bc + 1) {
      pGVar4 = (GLchar *)std::__cxx11::string::c_str();
      Utils::replaceToken(pGVar3,(size_t *)&shader_source_part_0,pGVar4,&local_218->m_code);
    }
  }
  else if (stage != FRAGMENT_SHADER) {
    pGVar4 = (GLchar *)std::__cxx11::string::c_str();
    Utils::replaceToken(pGVar3,(size_t *)&shader_source_part_0,pGVar4,&local_218->m_code);
  }
  std::__cxx11::string::~string((string *)&store_results);
  std::__cxx11::string::~string((string *)(out_color_definition.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(in_color_definition.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(out_tex_coord_definition.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(in_tex_coord_definition.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(out_color_reference.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(in_color_reference.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(out_tex_coord_reference.field_2._M_local_buf + 8));
  std::
  vector<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>
  ::~vector((vector<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>
             *)local_68);
  std::
  vector<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>
  ::~vector((vector<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>
             *)&out.
                super__Vector_base<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
  return;
}

Assistant:

void LineContinuationTest::prepareShaderSourceForDraw(Utils::SHADER_STAGES stage, bool use_version_400,
													  Utils::shaderSource& source)
{
	/* Templates */
	static const GLchar* shader_template_part_0 =
		"VERSION\n"
		"\n"
		"// Lorem ipsum dolor sit amCOMMENT_CASEet, consectetur adipiscing elit posuere.\n"
		"\n"
		"STAGE_SPECIFIC\n"
		"\n"
		"/* Lorem ipsum dolor sit amet, conCOMMENT_CASEsectetur adipiscing elit posuere. */\n"
		"\n"
		"IN_COLOR_DEFINITION\n"
		"IN_TEXTURE_COORDINATES_DEFINITION\n"
		"OUT_COLOR_DEFINITION\n"
		"OUT_TEXTURE_COORDINATES_DEFINITION\n"
		"uniform sampler2D uni_sampler;\n"
		"\n"
		"void funFUNCTION_CASEction(in veTYPE_CASEc4 in_vVARIABLE_CASEalue)\n"
		"{\n"
		"    OUT_COLOR ASSIGNMENT_BEFORE_OPERATOR_CASE=ASSIGNMENT_AFTER_OPERATOR_CASE inVARIABLE_CASE_value;\n"
		"}\n"
		"\n"
		"#define SET_PREPROCESSOR_INSIDE_CASERESULT(XX) "
		"PREPROCESSOR_BETWEEN_CASEfuncFUNCTION_CASEtion(XPREPROCESSOR_INSIDE_CASEX)\n"
		"NEXT_TO_TERMINATION_CASE\nTERMINATION_CASE";

	static const GLchar* shader_template_part_1 =
		"void main()\n"
		"{\n"
		"    vec2 coordinates   = TEXTURE_COORDINATES;\n"
		"    vec4 sampled_color = texture(uni_sampler, coordinates);\n"
		"    vec4 result        = vec4(0, 0VECTOR_VARIABLE_INITIALIZER_CASE, 0, 1);\n"
		"\n"
		"    if (PASS_CONDITION)\n"
		"    {\n"
		"        result = vecTYPE_CASE4(VECTOR_VARIABLE_INITIALIZER_CASE0, 1, 0, 1);\n"
		"    }\n"
		"    else\n"
		"    {\n"
		"        result = vec4(coordinates.xy, sampled_color.rg);\n"
		"    }\n"
		"\n"
		"STORE_RESULTS"
		"}\n"
		"NEXT_TO_TERMINATION_CASE\nTERMINATION_CASE";

	static const GLchar* store_results_template = "    SET_RESULT(result);\n"
												  "    TEXTURE_COORDINATES = coordinates;\n";

	static const GLchar* store_results_tcs_template = "    SET_RESULT(result);\n"
													  "    TEXTURE_COORDINATES = coordinates;\n"
													  "    gl_TessLevelOuter[0] = 1.0;\n"
													  "    gl_TessLevelOuter[1] = 1.0;\n"
													  "    gl_TessLevelOuter[2] = 1.0;\n"
													  "    gl_TessLevelOuter[3] = 1.0;\n"
													  "    gl_TessLevelInner[0] = 1.0;\n"
													  "    gl_TessLevelInner[1] = 1.0;\n";

	static const GLchar* store_results_fs_template = "    SET_RESULT(result);\n";

	static const GLchar* store_results_gs_template = "    gl_Position = vec4(-1, -1, 0, 1);\n"
													 "    SET_RESULT(result);\n"
													 "    TEXTURE_COORDINATES = coordinates + vec2(-0.25, -0.25);\n"
													 "    EmitVertex();\n"
													 "    gl_Position = vec4(-1, 1, 0, 1);\n"
													 "    SET_RESULT(result);\n"
													 "    TEXTURE_COORDINATES = coordinates + vec2(-0.25, 0.25);\n"
													 "    EmitVertex();\n"
													 "    gl_Position = vec4(1, -1, 0, 1);\n"
													 "    SET_RESULT(result);\n"
													 "    TEXTURE_COORDINATES = coordinates + vec2(0.25, -0.25);\n"
													 "    EmitVertex();\n"
													 "    gl_Position = vec4(1, 1, 0, 1);\n"
													 "    SET_RESULT(result);\n"
													 "    TEXTURE_COORDINATES = coordinates + vec2(0.25, 0.25);\n"
													 "    EmitVertex();\n";

	static const GLchar* pass_condition_template = "(EXPECTED_VALUE == sampled_color) &&\n"
												   "        (vec4(0, 1, 0, 1) == IN_COLOR) ";

	static const GLchar* pass_condition_vs_template = "EXPECTED_VALUE == sampled_color";

	/* Tokens to be replaced with GLSL stuff */
	static const GLchar* token_version		  = "VERSION";
	static const GLchar* token_stage_specific = "STAGE_SPECIFIC";

	static const GLchar* token_in_color_definition		= "IN_COLOR_DEFINITION";
	static const GLchar* token_in_tex_coord_definition  = "IN_TEXTURE_COORDINATES_DEFINITION";
	static const GLchar* token_out_color_definition		= "OUT_COLOR_DEFINITION";
	static const GLchar* token_out_tex_coord_definition = "OUT_TEXTURE_COORDINATES_DEFINITION";

	static const GLchar* token_expected_value	  = "EXPECTED_VALUE";
	static const GLchar* token_texture_coordinates = "TEXTURE_COORDINATES";
	static const GLchar* token_in_color			   = "IN_COLOR";
	static const GLchar* token_out_color		   = "OUT_COLOR";

	static const GLchar* token_store_results  = "STORE_RESULTS";
	static const GLchar* token_pass_condition = "PASS_CONDITION";

	/* Name of variable and empty string*/
	static const GLchar* color_name = "color";
	static const GLchar* empty		= "";

	/* GLSL stuff */
	const GLchar* version				= getVersionString(stage, use_version_400);
	const GLchar* stage_specific_layout = getStageSpecificLayout(stage);
	const GLchar* expected_value		= getExpectedValueString();

	/* Qualifiers */
	Utils::qualifierSet in;
	Utils::qualifierSet out;
	in.push_back(Utils::QUAL_IN);
	out.push_back(Utils::QUAL_OUT);

	/* In/Out variables definitions and references */
	std::string in_tex_coord_reference;
	std::string out_tex_coord_reference;
	std::string in_color_reference;
	std::string out_color_reference;
	std::string in_tex_coord_definition;
	std::string out_tex_coord_definition;
	std::string in_color_definition;
	std::string out_color_definition;

	Utils::prepareVariableStrings(stage, Utils::INPUT, in, "vec2", m_texture_coordinates_name, in_tex_coord_definition,
								  in_tex_coord_reference);
	Utils::prepareVariableStrings(stage, Utils::OUTPUT, out, "vec2", m_texture_coordinates_name,
								  out_tex_coord_definition, out_tex_coord_reference);
	Utils::prepareVariableStrings(stage, Utils::INPUT, in, "vec4", color_name, in_color_definition, in_color_reference);
	Utils::prepareVariableStrings(stage, Utils::OUTPUT, out, "vec4", color_name, out_color_definition,
								  out_color_reference);

	in_tex_coord_definition.append(";");
	out_tex_coord_definition.append(";");
	in_color_definition.append(";");
	out_color_definition.append(";");

	/* Select pass condition and store results tempaltes */
	const GLchar* store_results  = store_results_template;
	const GLchar* pass_condition = pass_condition_template;

	switch (stage)
	{
	case Utils::FRAGMENT_SHADER:
		store_results = store_results_fs_template;
		break;
	case Utils::GEOMETRY_SHADER:
		store_results = store_results_gs_template;
		break;
	case Utils::TESS_CTRL_SHADER:
		store_results = store_results_tcs_template;
		break;
	case Utils::VERTEX_SHADER:
		pass_condition = pass_condition_vs_template;
		break;
	default:
		break;
	};
	const GLuint store_results_length  = static_cast<GLuint>(strlen(store_results));
	const GLuint pass_condition_length = static_cast<GLuint>(strlen(pass_condition));

	/* Init strings with templates and replace all CASE tokens */
	if (true == isShaderMultipart())
	{
		source.m_parts[0].m_code = shader_template_part_0;
		source.m_parts[1].m_code = shader_template_part_1;

		replaceAllCaseTokens(source.m_parts[0].m_code);
		replaceAllCaseTokens(source.m_parts[1].m_code);
	}
	else
	{
		source.m_parts[0].m_code = shader_template_part_0;
		source.m_parts[0].m_code.append(shader_template_part_1);

		replaceAllCaseTokens(source.m_parts[0].m_code);
	}

	/* Get memory for shader source parts */
	const bool   is_multipart		  = isShaderMultipart();
	size_t		 position			  = 0;
	std::string& shader_source_part_0 = source.m_parts[0].m_code;
	std::string& shader_source_part_1 = (true == is_multipart) ? source.m_parts[1].m_code : source.m_parts[0].m_code;

	/* Replace tokens */
	/* Part 0 */
	Utils::replaceToken(token_version, position, version, shader_source_part_0);

	Utils::replaceToken(token_stage_specific, position, stage_specific_layout, shader_source_part_0);

	if (Utils::VERTEX_SHADER != stage)
	{
		Utils::replaceToken(token_in_color_definition, position, in_color_definition.c_str(), shader_source_part_0);
	}
	else
	{
		Utils::replaceToken(token_in_color_definition, position, empty, shader_source_part_0);
	}
	Utils::replaceToken(token_in_tex_coord_definition, position, in_tex_coord_definition.c_str(), shader_source_part_0);
	Utils::replaceToken(token_out_color_definition, position, out_color_definition.c_str(), shader_source_part_0);
	if (Utils::FRAGMENT_SHADER == stage)
	{
		Utils::replaceToken(token_out_tex_coord_definition, position, empty, shader_source_part_0);
	}
	else
	{
		Utils::replaceToken(token_out_tex_coord_definition, position, out_tex_coord_definition.c_str(),
							shader_source_part_0);
	}

	Utils::replaceToken(token_out_color, position, out_color_reference.c_str(), shader_source_part_0);

	/* Part 1 */
	if (true == is_multipart)
	{
		position = 0;
	}

	Utils::replaceToken(token_texture_coordinates, position, in_tex_coord_reference.c_str(), shader_source_part_1);

	Utils::replaceToken(token_pass_condition, position, pass_condition, shader_source_part_1);
	position -= pass_condition_length;

	Utils::replaceToken(token_expected_value, position, expected_value, shader_source_part_1);
	if (Utils::VERTEX_SHADER != stage)
	{
		Utils::replaceToken(token_in_color, position, in_color_reference.c_str(), shader_source_part_1);
	}

	Utils::replaceToken(token_store_results, position, store_results, shader_source_part_1);
	position -= store_results_length;

	if (Utils::GEOMETRY_SHADER == stage)
	{
		for (GLuint i = 0; i < 4; ++i)
		{
			Utils::replaceToken(token_texture_coordinates, position, out_tex_coord_reference.c_str(),
								shader_source_part_1);
		}
	}
	else if (Utils::FRAGMENT_SHADER == stage)
	{
		/* Nothing to be done */
	}
	else
	{
		Utils::replaceToken(token_texture_coordinates, position, out_tex_coord_reference.c_str(), shader_source_part_1);
	}
}